

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

bool __thiscall QTemporaryFileEngine::renameOverwrite(QTemporaryFileEngine *this,QString *newName)

{
  bool bVar1;
  byte bVar2;
  int in_ESI;
  int __fd;
  QTemporaryFileEngine *in_RDI;
  MaterializationMode in_stack_0000000c;
  bool ok;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 local_1;
  
  __fd = in_ESI;
  bVar1 = isUnnamedFile(in_RDI);
  if (bVar1) {
    bVar2 = materializeUnnamedFile(this,newName,in_stack_0000000c);
    QFSFileEngine::close(&in_RDI->super_QFSFileEngine,in_ESI);
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    QFSFileEngine::close(&in_RDI->super_QFSFileEngine,__fd);
    local_1 = QFSFileEngine::renameOverwrite
                        ((QFSFileEngine *)
                         CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                         (QString *)in_RDI);
  }
  return local_1;
}

Assistant:

bool QTemporaryFileEngine::renameOverwrite(const QString &newName)
{
    if (isUnnamedFile()) {
        bool ok = materializeUnnamedFile(newName, Overwrite);
        QFSFileEngine::close();
        return ok;
    }
#ifdef Q_OS_WIN
    if (flags & Win32NonShared) {
        QFileSystemEntry newEntry(newName, QFileSystemEntry::FromInternalPath());
        bool ok = d_func()->nativeRenameOverwrite(newEntry);
        QFSFileEngine::close();
        if (ok) {
            // Match what QFSFileEngine::renameOverwrite() does
            setFileEntry(std::move(newEntry));
        }
        return ok;
    }
#endif
    QFSFileEngine::close();
    return QFSFileEngine::renameOverwrite(newName);
}